

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionSet.cpp
# Opt level: O1

void __thiscall
OpenMD::SelectionSet::SelectionSet(SelectionSet *this,vector<int,_std::allocator<int>_> *nbits)

{
  long lVar1;
  _Bvector_base<std::allocator<bool>_> *this_00;
  long lVar2;
  OpenMDBitSet local_58;
  
  (this->bitsets_).super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bitsets_).super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bitsets_).super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::resize
            (&this->bitsets_,6);
  lVar2 = 0;
  lVar1 = 0;
  do {
    OpenMDBitSet::OpenMDBitSet
              (&local_58,
               (long)(nbits->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start[lVar1]);
    this_00 = (_Bvector_base<std::allocator<bool>_> *)
              ((long)&(((this->bitsets_).
                        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                        ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                      super__Bvector_base<std::allocator<bool>_> + lVar2);
    std::_Bvector_base<std::allocator<bool>_>::_M_deallocate(this_00);
    (this_00->_M_impl).super__Bvector_impl_data._M_end_of_storage =
         local_58.bitset_.super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_end_of_storage;
    (this_00->_M_impl).super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
         local_58.bitset_.super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
    (this_00->_M_impl).super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset =
         local_58.bitset_.super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
    *(undefined4 *)
     &(this_00->_M_impl).super__Bvector_impl_data._M_finish.super__Bit_iterator_base.field_0xc =
         local_58.bitset_.super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_finish.super__Bit_iterator_base._12_4_;
    (this_00->_M_impl).super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
         local_58.bitset_.super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    (this_00->_M_impl).super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset =
         local_58.bitset_.super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset;
    *(undefined4 *)
     &(this_00->_M_impl).super__Bvector_impl_data._M_start.super__Bit_iterator_base.field_0xc =
         local_58.bitset_.super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._12_4_;
    lVar1 = lVar1 + 1;
    lVar2 = lVar2 + 0x28;
  } while (lVar1 != 6);
  clearAll(this);
  return;
}

Assistant:

SelectionSet::SelectionSet(std::vector<int> nbits) {
    bitsets_.resize(N_SELECTIONTYPES);
    for (int i = 0; i < N_SELECTIONTYPES; i++)
      bitsets_[i] = OpenMDBitSet(nbits[i]);
    clearAll();
  }